

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O0

bool spvtools::opt::ExtInsConflict
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  uint *puVar5;
  const_reference pvVar6;
  ulong uVar7;
  uint local_34;
  uint32_t i;
  uint32_t numIndices;
  uint32_t insNumIndices;
  uint32_t extNumIndices;
  uint32_t extOffset_local;
  Instruction *insInst_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices_local;
  
  insNumIndices = extOffset;
  _extNumIndices = insInst;
  insInst_local = (Instruction *)extIndices;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(extIndices);
  uVar7 = (ulong)insNumIndices;
  uVar2 = Instruction::NumInOperands(_extNumIndices);
  if (sVar4 - uVar7 == (ulong)(uVar2 - 2)) {
    extIndices_local._7_1_ = false;
  }
  else {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)insInst_local);
    numIndices = (int)sVar4 - insNumIndices;
    uVar2 = Instruction::NumInOperands(_extNumIndices);
    i = uVar2 - 2;
    puVar5 = std::min<unsigned_int>(&numIndices,&i);
    uVar1 = *puVar5;
    for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)insInst_local,
                          (ulong)(local_34 + insNumIndices));
      uVar2 = *pvVar6;
      uVar3 = Instruction::GetSingleWordInOperand(_extNumIndices,local_34 + 2);
      if (uVar2 != uVar3) {
        return false;
      }
    }
    extIndices_local._7_1_ = true;
  }
  return extIndices_local._7_1_;
}

Assistant:

bool ExtInsConflict(const std::vector<uint32_t>& extIndices,
                    const Instruction* insInst, const uint32_t extOffset) {
  if (extIndices.size() - extOffset == insInst->NumInOperands() - 2)
    return false;
  uint32_t extNumIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  uint32_t insNumIndices = insInst->NumInOperands() - 2;
  uint32_t numIndices = std::min(extNumIndices, insNumIndices);
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}